

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

char * attr_list_to_string(attr_list attrs)

{
  AttrBuffer b;
  char *pcVar1;
  int len;
  uint local_1c;
  
  if (attrs != (attr_list)0x0) {
    b = (AttrBuffer)malloc(0x10);
    b->tmp_buffer = (void *)0x0;
    b->tmp_buffer_size = 0;
    b->tmp_buffer_in_use_size = 0;
    pcVar1 = (char *)encode_attr_for_xmit(attrs,b,(int *)&local_1c);
    pcVar1 = base64_encode(pcVar1,local_1c);
    free_AttrBuffer(b);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

extern
char *
attr_list_to_string(attr_list attrs)
{
    char * result;
    void *encoded;
    int len;
    AttrBuffer tmp;
    if (attrs == NULL) return NULL;
    tmp = create_AttrBuffer();

    encoded = encode_attr_for_xmit(attrs, tmp, &len);
    result = base64_encode(encoded, len);
    free_AttrBuffer(tmp);
    return result;
}